

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpUnSubscribeAsync(UpnpClient_Handle Hnd,char *SubsId,Upnp_FunPtr Fun,void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  undefined4 *__s;
  UpnpNonblockParam *Param;
  Handle_Info *SInfo;
  ThreadPoolJob job;
  int retVal;
  void *Cookie_const_local;
  Upnp_FunPtr Fun_local;
  char *SubsId_local;
  UpnpClient_Handle Hnd_local;
  
  job.jobId = 0;
  Param = (UpnpNonblockParam *)0x0;
  memset(&SInfo,0,0x30);
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x967,"Inside UpnpUnSubscribeAsync\n");
  if (UpnpSdkInit == 1) {
    if (SubsId == (char *)0x0) {
      job.jobId = -0x65;
    }
    else if (Fun == (Upnp_FunPtr)0x0) {
      job.jobId = -0x65;
    }
    else {
      HandleReadLock(".upnp/src/api/upnpapi.c",0x978);
      UVar1 = GetHandleInfo(Hnd,(Handle_Info **)&Param);
      if (UVar1 == HND_CLIENT) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x981);
        __s = (undefined4 *)malloc(0x760);
        if (__s == (undefined4 *)0x0) {
          job.jobId = -0x68;
        }
        else {
          memset(__s,0,0x760);
          *__s = 1;
          __s[1] = Hnd;
          strncpy((char *)(__s + 0x1c3),SubsId,0x2b);
          *(Upnp_FunPtr *)(__s + 0x1d0) = Fun;
          *(void **)(__s + 0x1ce) = Cookie_const;
          TPJobInit((ThreadPoolJob *)&SInfo,UpnpThreadDistribution,__s);
          TPJobSetFreeFunction((ThreadPoolJob *)&SInfo,free);
          TPJobSetPriority((ThreadPoolJob *)&SInfo,MED_PRIORITY);
          iVar2 = ThreadPoolAdd(&gSendThreadPool,(ThreadPoolJob *)&SInfo,(int *)0x0);
          if (iVar2 != 0) {
            free(__s);
          }
        }
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x97d);
        job.jobId = -100;
      }
    }
  }
  else {
    job.jobId = -0x74;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x99b,"Exiting UpnpUnSubscribeAsync\n");
  return job.jobId;
}

Assistant:

int UpnpUnSubscribeAsync(UpnpClient_Handle Hnd,
	Upnp_SID SubsId,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	int retVal = UPNP_E_SUCCESS;
	ThreadPoolJob job;
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;

	memset(&job, 0, sizeof(job));

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpUnSubscribeAsync\n");

	if (UpnpSdkInit != 1) {
		retVal = UPNP_E_FINISH;
		goto exit_function;
	}

	if (SubsId == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (Fun == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		retVal = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	HandleUnlock(__FILE__, __LINE__);

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));
	if (Param == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = UNSUBSCRIBE;
	Param->Handle = Hnd;
	strncpy(Param->SubsId, SubsId, sizeof(Param->SubsId) - 1);
	Param->Fun = Fun;
	Param->Cookie = (void *)Cookie_const;
	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free);
	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free(Param);
	}

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpUnSubscribeAsync\n");

	return retVal;
}